

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxIfStatement::Emit(FxIfStatement *this,VMFunctionBuilder *build)

{
  uint uVar1;
  undefined1 local_50 [8];
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  size_t jumpspot;
  ExpEmit v;
  VMFunctionBuilder *build_local;
  FxIfStatement *this_local;
  
  v = (ExpEmit)build;
  ExpEmit::ExpEmit((ExpEmit *)&jumpspot);
  yes.Most = 0xffffffff;
  yes.Count = 0;
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)local_50);
  (*this->Condition->_vptr_FxExpression[10])
            (this->Condition,v,(ulong)(this->WhenTrue == (FxExpression *)0x0),&no.Most,local_50);
  if (this->WhenTrue != (FxExpression *)0x0) {
    VMFunctionBuilder::BackpatchListToHere
              ((VMFunctionBuilder *)v,(TArray<unsigned_long,_unsigned_long> *)&no.Most);
    FxExpression::EmitStatement(this->WhenTrue,(VMFunctionBuilder *)v);
  }
  if (this->WhenFalse == (FxExpression *)0x0) {
    VMFunctionBuilder::BackpatchListToHere
              ((VMFunctionBuilder *)v,(TArray<unsigned_long,_unsigned_long> *)local_50);
  }
  else {
    if (this->WhenTrue != (FxExpression *)0x0) {
      uVar1 = (*this->WhenTrue->_vptr_FxExpression[7])();
      if ((uVar1 & 1) == 0) {
        yes._8_8_ = VMFunctionBuilder::Emit((VMFunctionBuilder *)v,0x44,0);
      }
      VMFunctionBuilder::BackpatchListToHere
                ((VMFunctionBuilder *)v,(TArray<unsigned_long,_unsigned_long> *)local_50);
    }
    FxExpression::EmitStatement(this->WhenFalse,(VMFunctionBuilder *)v);
    if (yes._8_8_ != 0xffffffff) {
      VMFunctionBuilder::BackpatchToHere((VMFunctionBuilder *)v,yes._8_8_);
    }
    if (this->WhenTrue == (FxExpression *)0x0) {
      VMFunctionBuilder::BackpatchListToHere
                ((VMFunctionBuilder *)v,(TArray<unsigned_long,_unsigned_long> *)local_50);
    }
  }
  ExpEmit::ExpEmit((ExpEmit *)&this_local);
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)local_50);
  TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxIfStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit v;
	size_t jumpspot = ~0u;

	TArray<size_t> yes, no;
	Condition->EmitCompare(build, WhenTrue == nullptr, yes, no);

	if (WhenTrue != nullptr)
	{
		build->BackpatchListToHere(yes);
		WhenTrue->EmitStatement(build);
	}
	if (WhenFalse != nullptr)
	{
		if (WhenTrue != nullptr)
		{
			if (!WhenTrue->CheckReturn()) jumpspot = build->Emit(OP_JMP, 0);	// no need to emit a jump if the block returns.
			build->BackpatchListToHere(no);
		}
		WhenFalse->EmitStatement(build);
		if (jumpspot != ~0u) build->BackpatchToHere(jumpspot);
		if (WhenTrue == nullptr) build->BackpatchListToHere(no);
	}
	else
	{
		build->BackpatchListToHere(no);
	}
	return ExpEmit();
}